

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O2

void __thiscall
Clasp::Asp::PrgDepGraph::addNonHcf
          (PrgDepGraph *this,uint32 id,SharedContext *ctx,Configuration *config,uint32 scc)

{
  undefined1 *puVar1;
  pointer pAVar2;
  NodeId *pNVar3;
  pointer pBVar4;
  uint32 i;
  size_type sVar5;
  ulong uVar6;
  NonHcfComponent *this_00;
  uint uVar7;
  NodeId *x;
  NonHcfComponent *local_78;
  uint32 local_70;
  uint local_6c;
  VarVec sccAtoms;
  VarVec sccBodies;
  
  sccAtoms.ebo_.buf = (pointer)0x0;
  sccAtoms.ebo_.size = 0;
  sccAtoms.ebo_.cap = 0;
  sccBodies.ebo_.buf = (pointer)0x0;
  sccBodies.ebo_.size = 0;
  sccBodies.ebo_.cap = 0;
  uVar6 = 0;
  local_70 = id;
  while( true ) {
    sVar5 = (size_type)uVar6;
    local_78 = (NonHcfComponent *)CONCAT44(local_78._4_4_,sVar5);
    if (sVar5 == (this->atoms_).ebo_.size) break;
    if ((*(uint *)&(this->atoms_).ebo_.buf[uVar6].super_Node.field_0x4 & 0xfffffff) == scc) {
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&sccAtoms,(uint *)&local_78);
      puVar1 = &(this->atoms_).ebo_.buf[(ulong)local_78 & 0xffffffff].super_Node.field_0x4;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x80000000;
      sVar5 = (size_type)local_78;
    }
    uVar6 = (ulong)(sVar5 + 1);
  }
  uVar7 = 0;
  while (uVar7 != sccAtoms.ebo_.size) {
    pAVar2 = (this->atoms_).ebo_.buf;
    pNVar3 = pAVar2[sccAtoms.ebo_.buf[uVar7]].super_Node.sep_;
    local_6c = uVar7;
    for (x = pAVar2[sccAtoms.ebo_.buf[uVar7]].super_Node.adj_; x != pNVar3; x = x + 1) {
      uVar7 = *x;
      pBVar4 = (this->bodies_).ebo_.buf;
      if (-1 < *(int *)&pBVar4[uVar7].super_Node.field_0x4) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&sccBodies,x);
        puVar1 = &pBVar4[uVar7].super_Node.field_0x7;
        *puVar1 = *puVar1 | 0x80;
      }
    }
    uVar7 = local_6c + 1;
  }
  for (uVar7 = 0; uVar7 != sccBodies.ebo_.size; uVar7 = uVar7 + 1) {
    puVar1 = &(this->bodies_).ebo_.buf[sccBodies.ebo_.buf[uVar7]].super_Node.field_0x4;
    *(uint *)puVar1 = *(uint *)puVar1 & 0x7fffffff;
  }
  this_00 = (NonHcfComponent *)operator_new(0x20);
  NonHcfComponent::NonHcfComponent(this_00,local_70,this,ctx,config,scc,&sccAtoms,&sccBodies);
  local_78 = this_00;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
  ::push_back(&this->components_,&local_78);
  if (this->stats_ != (NonHcfStats *)0x0) {
    NonHcfStats::addHcc(this->stats_,(this->components_).ebo_.buf[(this->components_).ebo_.size - 1]
                       );
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&sccBodies.ebo_);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&sccAtoms.ebo_);
  return;
}

Assistant:

void PrgDepGraph::addNonHcf(uint32 id, SharedContext& ctx, Configuration* config, uint32 scc) {
	VarVec sccAtoms, sccBodies;
	// get all atoms from scc
	for (uint32 i = 0; i != numAtoms(); ++i) {
		if (getAtom(i).scc == scc) {
			sccAtoms.push_back(i);
			atoms_[i].set(AtomNode::property_in_non_hcf);
		}
	}
	// get all bodies defining an atom in scc
	const Solver& generator = *ctx.master(); (void)generator;
	for (uint32 i = 0; i != sccAtoms.size(); ++i) {
		const AtomNode& a = getAtom(sccAtoms[i]);
		for (const NodeId* bodyIt = a.bodies_begin(), *bodyEnd = a.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
			BodyNode& B = bodies_[*bodyIt];
			if (!B.seen()) {
				assert(generator.value(B.lit.var()) != value_free || !generator.seen(B.lit));
				sccBodies.push_back(*bodyIt);
				B.seen(true);
			}
		}
	}
	for (uint32 i = 0; i != sccBodies.size(); ++i) { bodies_[sccBodies[i]].seen(false); }
	components_.push_back( new NonHcfComponent(id, *this, ctx, config, scc, sccAtoms, sccBodies) );
	if (stats_) { stats_->addHcc(*components_.back()); }
}